

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field_operators.cpp
# Opt level: O2

void __thiscall Field_operators_properties::test_method(Field_operators_properties *this)

{
  Z2_field_operators z2op;
  Zp_field_operators<unsigned_int,_void> zpop;
  
  test_z2_standart_field_properties<Gudhi::persistence_fields::Z2_field_operators>(&z2op);
  zpop.characteristic_ = 0;
  zpop.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  zpop.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  zpop.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::set_characteristic(&zpop,2);
  test_z2_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
            (&zpop);
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::set_characteristic(&zpop,5);
  test_z5_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
            (&zpop);
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::set_characteristic(&zpop,7);
  test_z7_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
            (&zpop);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&zpop.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Field_operators_properties) {
  Z2_field_operators z2op;
  test_z2_standart_field_properties(z2op);

  Zp_field_operators zpop;
  zpop.set_characteristic(2);
  test_z2_standart_field_properties(zpop);
  zpop.set_characteristic(5);
  test_z5_standart_field_properties(zpop);
  zpop.set_characteristic(7);
  test_z7_standart_field_properties(zpop);
}